

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O1

void __thiscall QUrl::setHost(QUrl *this,QString *host,ParsingMode mode)

{
  uchar *puVar1;
  QUrlPrivate *pQVar2;
  Error *pEVar3;
  bool bVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  QLatin1StringView after;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  detach(this);
  pQVar2 = this->d;
  pEVar3 = (pQVar2->error)._M_t.
           super___uniq_ptr_impl<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>._M_t.
           super__Tuple_impl<0UL,_QUrlPrivate::Error_*,_std::default_delete<QUrlPrivate::Error>_>.
           super__Head_base<0UL,_QUrlPrivate::Error_*,_false>._M_head_impl;
  (pQVar2->error)._M_t.
  super___uniq_ptr_impl<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>._M_t.
  super__Tuple_impl<0UL,_QUrlPrivate::Error_*,_std::default_delete<QUrlPrivate::Error>_>.
  super__Head_base<0UL,_QUrlPrivate::Error_*,_false>._M_head_impl = (Error *)0x0;
  if (pEVar3 != (Error *)0x0) {
    std::default_delete<QUrlPrivate::Error>::operator()
              ((default_delete<QUrlPrivate::Error> *)&pQVar2->error,pEVar3);
  }
  local_38.d.d = (host->d).d;
  local_38.d.ptr = (host->d).ptr;
  local_38.d.size = (host->d).size;
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_38.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_38.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (mode == DecodedMode) {
    mode = TolerantMode;
    after.m_data = "%25";
    after.m_size = 3;
    QString::replace(&local_38,(QChar)0x25,after,CaseSensitive);
  }
  bVar4 = QUrlPrivate::setHost(this->d,&local_38,0,local_38.d.size,mode);
  if (!bVar4) {
    bVar4 = QString::startsWith(&local_38,(QChar)0x5b,CaseSensitive);
    if (!bVar4) {
      QString::insert(&local_38,0,(QChar)0x5b);
      QString::append(&local_38,(QChar)0x5d);
      bVar4 = QUrlPrivate::setHost(this->d,&local_38,0,local_38.d.size,mode);
      if (bVar4) {
        pQVar2 = this->d;
        pEVar3 = (pQVar2->error)._M_t.
                 super___uniq_ptr_impl<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QUrlPrivate::Error_*,_std::default_delete<QUrlPrivate::Error>_>
                 .super__Head_base<0UL,_QUrlPrivate::Error_*,_false>._M_head_impl;
        (pQVar2->error)._M_t.
        super___uniq_ptr_impl<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>._M_t.
        super__Tuple_impl<0UL,_QUrlPrivate::Error_*,_std::default_delete<QUrlPrivate::Error>_>.
        super__Head_base<0UL,_QUrlPrivate::Error_*,_false>._M_head_impl = (Error *)0x0;
        if (pEVar3 != (Error *)0x0) {
          std::default_delete<QUrlPrivate::Error>::operator()
                    ((default_delete<QUrlPrivate::Error> *)&pQVar2->error,pEVar3);
        }
      }
      else {
        qVar5 = QString::indexOf(&local_38,(QChar)0x3a,0,CaseSensitive);
        if (qVar5 != -1) {
          ((this->d->error)._M_t.
           super___uniq_ptr_impl<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>._M_t.
           super__Tuple_impl<0UL,_QUrlPrivate::Error_*,_std::default_delete<QUrlPrivate::Error>_>.
           super__Head_base<0UL,_QUrlPrivate::Error_*,_false>._M_head_impl)->code =
               InvalidIPv6AddressError;
        }
        puVar1 = &this->d->sectionIsPresent;
        *puVar1 = *puVar1 & 0xf7;
      }
    }
  }
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUrl::setHost(const QString &host, ParsingMode mode)
{
    detach();
    d->clearError();

    QString data = host;
    if (mode == DecodedMode) {
        data.replace(u'%', "%25"_L1);
        mode = TolerantMode;
    }

    if (d->setHost(data, 0, data.size(), mode)) {
        return;
    } else if (!data.startsWith(u'[')) {
        // setHost failed, it might be IPv6 or IPvFuture in need of bracketing
        Q_ASSERT(d->error);

        data.prepend(u'[');
        data.append(u']');
        if (!d->setHost(data, 0, data.size(), mode)) {
            // failed again
            if (data.contains(u':')) {
                // source data contains ':', so it's an IPv6 error
                d->error->code = QUrlPrivate::InvalidIPv6AddressError;
            }
            d->sectionIsPresent &= ~QUrlPrivate::Host;
        } else {
            // succeeded
            d->clearError();
        }
    }
}